

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPostIdxImm8s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  MCOperand *op;
  ulong uVar4;
  SStream *in_RDX;
  char *pcVar5;
  uint in_ESI;
  MCInst *in_RDI;
  int v;
  int Imm;
  MCOperand *MO;
  int local_2c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar4 = MCOperand_getImm(op);
  uVar3 = (uint)uVar4;
  if ((uVar3 & 0xff) * 4 < 10) {
    pcVar5 = "-";
    if ((uVar4 & 0x100) != 0) {
      pcVar5 = anon_var_dwarf_290687 + 0x11;
    }
    SStream_concat(in_RDX,"#%s%u",pcVar5,(ulong)((uVar3 & 0xff) << 2));
  }
  else {
    pcVar5 = "-";
    if ((uVar4 & 0x100) != 0) {
      pcVar5 = anon_var_dwarf_290687 + 0x11;
    }
    SStream_concat(in_RDX,"#%s0x%x",pcVar5,(ulong)((uVar3 & 0xff) << 2));
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    if ((uVar4 & 0x100) == 0) {
      local_2c = (uVar3 & 0xff) * -4;
    }
    else {
      local_2c = (uVar3 & 0xff) << 2;
    }
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(in_RDI->flat_insn->detail->groups +
            (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = local_2c;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printPostIdxImm8s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	int Imm = (int)MCOperand_getImm(MO);

	if (((Imm & 0xff) << 2) > HEX_THRESHOLD) {
		SStream_concat(O, "#%s0x%x", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	} else {
		SStream_concat(O, "#%s%u", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	}

	if (MI->csh->detail) {
		int v = (Imm & 256) ? ((Imm & 0xff) << 2) : -((Imm & 0xff) << 2);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = v;
		MI->flat_insn->detail->arm.op_count++;
	}
}